

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogbox.cpp
# Opt level: O3

int __thiscall dialogbox::EndGameDialogBox(dialogbox *this,int black,int white,int turn)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[19;7Hblack:",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,black);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," white:",7);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,white);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," turn:",6);
  std::ostream::operator<<(poVar1,turn);
  return 1;
}

Assistant:

int dialogbox::EndGameDialogBox(int black, int white, int turn){
	std::cout<<"\e[19;7Hblack:"<<black<<" white:"<<white<<" turn:"<<turn;
	return 1;
}